

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
ExampleUnits_unitsScalingWithUnresolvedImports_Test::TestBody
          (ExampleUnits_unitsScalingWithUnresolvedImports_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_130 [8];
  Message local_128 [8];
  double local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  double scaling;
  string local_f8 [32];
  undefined1 local_d8 [8];
  UnitsPtr u1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  UnitsPtr u2;
  ModelPtr model;
  ParserPtr parser;
  allocator<char> local_31;
  string local_30 [8];
  string modelString;
  ExampleUnits_unitsScalingWithUnresolvedImports_Test *this_local;
  
  modelString.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"my_model.cellml\">\n    <units units_ref=\"my_units\" name=\"my_units\"/>\n  </import>\n  <units name=\"strange_units\">\n    <unit units=\"my_units\"/>\n    <unit exponent=\"-1\" units=\"\"/>\n  </units>\n</model>"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel
            ((string *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"units",&local_99);
  libcellml::Units::create((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"banana",
             (allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"strange_units",(allocator<char> *)((long)&scaling + 7));
  libcellml::Model::units((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&scaling + 7));
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       libcellml::Units::scalingFactor((shared_ptr *)local_d8,(shared_ptr *)local_78,false);
  local_120 = 0.0;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_118,"0.0","scaling",&local_120,(double *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_128);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xabd,pcVar4);
    testing::internal::AssertHelper::operator=(local_130,local_128);
    testing::internal::AssertHelper::~AssertHelper(local_130);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_d8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(ExampleUnits, unitsScalingWithUnresolvedImports)
{
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"my_model.cellml\">\n"
        "    <units units_ref=\"my_units\" name=\"my_units\"/>\n"
        "  </import>\n"
        "  <units name=\"strange_units\">\n"
        "    <unit units=\"my_units\"/>\n"
        "    <unit exponent=\"-1\" units=\"\"/>\n"
        "  </units>\n"
        "</model>";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelString);
    auto u2 = libcellml::Units::create("units");
    u2->addUnit("banana");

    model->addUnits(u2);
    auto u1 = model->units("strange_units");

    auto scaling = libcellml::Units::scalingFactor(u1, u2, false);
    EXPECT_EQ(0.0, scaling);
}